

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O3

bool Image_Function::
     IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t width,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  bool bVar1;
  ImageTemplate<unsigned_char> local_48;
  
  if (image->_rowSize == width) {
    local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    local_48._data = (uchar *)0x0;
    local_48._type = args_1->_type;
    PenguinV_Image::ImageTemplate<unsigned_char>::copy
              (&local_48,(EVP_PKEY_CTX *)args_1,(EVP_PKEY_CTX *)args);
    local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
    bVar1 = width == local_48._rowSize && args->_rowSize == width;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsFullImageRow( uint32_t width, const TImage & image )
    {
        return image.rowSize() == width;
    }